

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O3

Option * __thiscall MetaCommand::GetOptionByMinusTag(MetaCommand *this,string *minusTag)

{
  bool bVar1;
  undefined1 *puVar2;
  Option *pOVar3;
  int iVar4;
  Option *pOVar5;
  string tagToSearch;
  Option *local_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pOVar5 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pOVar5 == (this->m_OptionVector).
                  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      return (Option *)0x0;
    }
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-","");
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)(pOVar5->tag)._M_dataplus._M_p);
    puVar2 = local_50;
    if ((local_48 != minusTag->_M_string_length) ||
       ((bVar1 = true, pOVar3 = pOVar5, local_48 != 0 &&
        (iVar4 = bcmp(local_50,(minusTag->_M_dataplus)._M_p,local_48), iVar4 != 0)))) {
      pOVar5 = pOVar5 + 1;
      bVar1 = false;
      pOVar3 = local_58;
    }
    local_58 = pOVar3;
    if (puVar2 != local_40) {
      operator_delete(puVar2);
    }
  } while (!bVar1);
  return local_58;
}

Assistant:

MetaCommand::Option *
MetaCommand::GetOptionByMinusTag(METAIO_STL::string minusTag)
{
  auto it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    METAIO_STL::string tagToSearch = "-";
    tagToSearch += (*it).tag;
    if(tagToSearch == minusTag)
      {
      return &(*it);
      }
    ++it;
    }
    return nullptr;
}